

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O3

void USPE(double *inp,int N,int p,int q,double *phi,double *theta,double *thetac,double *var)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint N_00;
  double *acov;
  long lVar5;
  double *A;
  double *b;
  int *ipiv;
  double *__dest;
  undefined8 *__ptr;
  double *array;
  double *__s;
  double *x;
  double *A_00;
  int *ipiv_00;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  
  uVar11 = (ulong)(uint)q;
  iVar4 = p + 1 + q;
  acov = (double *)malloc((long)iVar4 * 8);
  lVar5 = (long)p;
  A = (double *)malloc(lVar5 * 8 * lVar5);
  b = (double *)malloc(lVar5 * 8);
  ipiv = (int *)malloc(lVar5 * 4);
  N_00 = q + 1;
  lVar20 = (long)(int)N_00;
  sVar1 = lVar20 * 8;
  __dest = (double *)malloc(sVar1);
  __ptr = (undefined8 *)malloc((long)(int)(p + 1U) << 3);
  array = (double *)malloc(sVar1);
  __s = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  A_00 = (double *)malloc(sVar1 * lVar20);
  ipiv_00 = (int *)malloc(lVar20 << 2);
  autocovar(inp,N,acov,iVar4);
  dVar21 = mean(inp,N);
  *__ptr = 0xbff0000000000000;
  if (0 < p) {
    memset(phi,0,(ulong)(uint)p << 3);
  }
  if (0 < q) {
    memset(theta,0,uVar11 * 8);
  }
  lVar20 = (long)q;
  uVar6 = (ulong)(p + 1U);
  if (p < 1) {
LAB_00134098:
    if (p != 0) goto LAB_0013409d;
    if (q < 0) goto LAB_00134166;
    memcpy(__dest,acov,(ulong)N_00 << 3);
  }
  else {
    uVar8 = 1;
    uVar9 = uVar11;
    pdVar7 = A;
    do {
      iVar4 = (int)uVar9;
      lVar17 = 0;
      do {
        iVar16 = (int)uVar9;
        uVar14 = (ulong)(uint)-iVar16;
        if (0 < iVar16) {
          uVar14 = uVar9;
        }
        pdVar7[lVar17] = acov[uVar14];
        lVar17 = lVar17 + 1;
        uVar9 = (ulong)(iVar16 - 1);
      } while (uVar6 - 1 != lVar17);
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + lVar5;
      uVar9 = (ulong)(iVar4 + 1);
    } while (uVar8 != uVar6);
    memcpy(b,acov + lVar20 + 1,(ulong)(uint)p * 8);
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
    if (p < 1) goto LAB_00134098;
    memcpy(__ptr + 1,phi,(ulong)(uint)p << 3);
LAB_0013409d:
    if (q < 0) {
LAB_00134166:
      dVar22 = *__dest;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      *__s = dVar22;
      bVar3 = true;
      goto LAB_001341f5;
    }
    uVar9 = 0;
    do {
      dVar22 = 0.0;
      if (-1 < p) {
        uVar8 = uVar9 & 0xffffffff;
        uVar14 = 0;
        do {
          iVar4 = (int)uVar8;
          uVar18 = 0;
          do {
            iVar16 = (int)uVar8;
            uVar19 = (ulong)(uint)-iVar16;
            if (0 < iVar16) {
              uVar19 = uVar8;
            }
            dVar22 = dVar22 + (double)__ptr[uVar18] * (double)__ptr[uVar14] * acov[uVar19];
            uVar18 = uVar18 + 1;
            uVar8 = (ulong)(iVar16 - 1);
          } while (uVar6 != uVar18);
          uVar14 = uVar14 + 1;
          uVar8 = (ulong)(iVar4 + 1);
        } while (uVar14 != uVar6);
      }
      __dest[uVar9] = dVar22;
      uVar9 = uVar9 + 1;
    } while (uVar9 != N_00);
  }
  sVar1 = (ulong)N_00 * 8;
  memset(__s,0,sVar1);
  memset(array,0,sVar1);
  dVar22 = *__dest;
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  *__s = dVar22;
  uVar6 = 0;
  pdVar7 = __s;
  uVar12 = N_00;
  do {
    dVar22 = array[uVar6];
    if (uVar6 <= uVar11) {
      uVar9 = 0;
      do {
        dVar22 = dVar22 + __s[uVar9] * pdVar7[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
    array[uVar6] = dVar22 - __dest[uVar6];
    uVar6 = uVar6 + 1;
    uVar12 = uVar12 - 1;
    pdVar7 = pdVar7 + 1;
  } while (uVar6 != N_00);
  bVar3 = false;
LAB_001341f5:
  dVar22 = array_max_abs(array,N_00);
  if (0.0001 < dVar22) {
    uVar11 = (ulong)N_00;
    uVar12 = 0;
    do {
      if (bVar3) {
        ludecomp(A_00,N_00,ipiv_00);
        linsolve(A_00,N_00,array,ipiv_00,x);
      }
      else {
        lVar5 = 0;
        uVar6 = 0;
        pdVar7 = __s;
        pdVar10 = __s;
        pdVar15 = A_00;
        do {
          uVar9 = 0;
          do {
            dVar22 = 0.0;
            if ((long)(uVar6 + uVar9) <= lVar20) {
              dVar22 = pdVar7[uVar9] + 0.0;
            }
            if (-1 < (long)(lVar5 + uVar9)) {
              dVar22 = dVar22 + pdVar10[uVar9];
            }
            pdVar15[uVar9] = dVar22;
            uVar9 = uVar9 + 1;
          } while (uVar11 != uVar9);
          uVar6 = uVar6 + 1;
          pdVar15 = pdVar15 + uVar11;
          lVar5 = lVar5 + -1;
          pdVar10 = pdVar10 + -1;
          pdVar7 = pdVar7 + 1;
        } while (uVar6 != uVar11);
        ludecomp(A_00,N_00,ipiv_00);
        linsolve(A_00,N_00,array,ipiv_00,x);
        memset(array,0,uVar11 * 8);
        uVar6 = 0;
        do {
          __s[uVar6] = __s[uVar6] - x[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
        uVar6 = 0;
        pdVar7 = __s;
        uVar13 = N_00;
        do {
          dVar22 = array[uVar6];
          if ((long)uVar6 <= lVar20) {
            uVar9 = 0;
            do {
              dVar22 = dVar22 + __s[uVar9] * pdVar7[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar13 != uVar9);
          }
          array[uVar6] = dVar22 - __dest[uVar6];
          uVar6 = uVar6 + 1;
          uVar13 = uVar13 - 1;
          pdVar7 = pdVar7 + 1;
        } while (uVar6 != uVar11);
      }
      dVar22 = array_max_abs(array,N_00);
    } while ((0.0001 < dVar22) && (bVar2 = uVar12 < 199, uVar12 = uVar12 + 1, bVar2));
  }
  if (0 < p) {
    dVar22 = 0.0;
    uVar11 = 0;
    do {
      dVar22 = dVar22 + (double)__ptr[uVar11 + 1];
      uVar11 = uVar11 + 1;
    } while ((uint)p != uVar11);
    dVar21 = dVar21 * (1.0 - dVar22);
  }
  *thetac = dVar21;
  dVar21 = *__s;
  if (0 < q) {
    lVar5 = 0;
    do {
      theta[lVar5] = -__s[lVar5 + 1] / dVar21;
      lVar5 = lVar5 + 1;
    } while ((ulong)N_00 - 1 != lVar5);
  }
  *var = dVar21 * dVar21;
  if (q == 0) {
    if (p < 1) {
      dVar21 = 0.0;
    }
    else {
      dVar21 = 0.0;
      uVar11 = 0;
      do {
        lVar5 = uVar11 + 1;
        lVar20 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        dVar21 = dVar21 + acov[lVar5] * (double)__ptr[lVar20];
      } while ((uint)p != uVar11);
    }
    *var = *acov - dVar21;
  }
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__dest);
  free(__ptr);
  free(array);
  free(__s);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE(double *inp,int N,int p, int q, double *phi,double *theta,double *thetac,double *var) {
	int K,i,j,l,t,temp,it1;
	double wmean,tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h;
	int *ipiv,*ipiv2;

	K = p + q + 1;

	c = (double *) malloc(sizeof(double) * K);
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,c,K);
	wmean = mean(inp,N);
	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	*thetac = 0.0;

	if (p > 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd += x[i+1];
		}
		*thetac = wmean * (1.0 - tempd);
	} else {
		*thetac = wmean;
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}

	*var = tau[0] * tau[0];

	if (q == 0) {
		tempd = 0.0;
		for(i = 0; i < p;++i) {
			tempd = tempd + c[i+1] * x[i+1];
		}
		*var = c[0] - tempd;
	}

	free(c);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);
}